

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_vacuum.cpp
# Opt level: O3

void __thiscall
duckdb::LogicalVacuum::LogicalVacuum
          (LogicalVacuum *this,
          unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true> *info)

{
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_VACUUM);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalVacuum_0244e030;
  (this->table).ptr = (TableCatalogEntry *)0x0;
  (this->column_id_map)._M_h._M_buckets = &(this->column_id_map)._M_h._M_single_bucket;
  (this->column_id_map)._M_h._M_bucket_count = 1;
  (this->column_id_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->column_id_map)._M_h._M_element_count = 0;
  (this->column_id_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->column_id_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->column_id_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->info).super_unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::VacuumInfo_*,_std::default_delete<duckdb::VacuumInfo>_>.
  super__Head_base<0UL,_duckdb::VacuumInfo_*,_false>._M_head_impl =
       (info->super_unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>)._M_t.
       super___uniq_ptr_impl<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::VacuumInfo_*,_std::default_delete<duckdb::VacuumInfo>_>.
       super__Head_base<0UL,_duckdb::VacuumInfo_*,_false>._M_head_impl;
  (info->super_unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::VacuumInfo_*,_std::default_delete<duckdb::VacuumInfo>_>.
  super__Head_base<0UL,_duckdb::VacuumInfo_*,_false>._M_head_impl = (VacuumInfo *)0x0;
  return;
}

Assistant:

LogicalVacuum::LogicalVacuum(unique_ptr<VacuumInfo> info)
    : LogicalOperator(LogicalOperatorType::LOGICAL_VACUUM), info(std::move(info)) {
}